

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O0

void (anonymous_namespace)::test_color<color<unsigned_int,4u>>
               (color<unsigned_int,_4U> input,color<unsigned_int,_4U> output)

{
  Type i_00;
  bool bVar1;
  Type TVar2;
  uint32_t uVar3;
  uint *puVar4;
  AssertHelper *this;
  AssertionResult gtest_ar_1;
  uint32_t i_2;
  AssertionResult gtest_ar;
  uint32_t i_1;
  uint32_t i;
  color<unsigned_int,_4U> color;
  AssertHelper *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar5;
  color<unsigned_int,_4U> *in_stack_ffffffffffffff40;
  uint *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint uVar6;
  Type type;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult local_88;
  uint local_74;
  Message *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  AssertionResult local_48;
  uint local_38;
  Type local_34;
  color<unsigned_int,_4U> local_30;
  color<unsigned_int,_4U> local_20;
  color<unsigned_int,_4U> local_10;
  
  color<unsigned_int,_4U>::color(&local_30);
  local_34 = kSuccess;
  while (type = local_34, TVar2 = color<unsigned_int,_4U>::comps_count(&local_30), i_00 = local_34,
        type < TVar2) {
    puVar4 = color<unsigned_int,_4U>::operator[](&local_10,local_34);
    color<unsigned_int,_4U>::set(&local_30,i_00,*puVar4);
    local_34 = local_34 + kNonFatalFailure;
  }
  local_38 = 0;
  while (uVar6 = local_38, uVar3 = color<unsigned_int,_4U>::comps_count(&local_30), uVar6 < uVar3) {
    in_stack_ffffffffffffff48 = color<unsigned_int,_4U>::operator[](&local_30,local_38);
    puVar4 = color<unsigned_int,_4U>::operator[](&local_10,local_38);
    in_stack_ffffffffffffffb4 = *puVar4;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((char *)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
               (uint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (uint *)in_stack_ffffffffffffff30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_48);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff40 =
           (color<unsigned_int,_4U> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x11eb69);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff60,type,(char *)CONCAT44(uVar6,in_stack_ffffffffffffff50),
                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(char *)in_stack_ffffffffffffff40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff30);
      testing::Message::~Message((Message *)0x11ebbd);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ec13);
    local_38 = local_38 + 1;
  }
  color<unsigned_int,_4U>::normalize(in_stack_ffffffffffffff40);
  local_74 = 0;
  while (uVar5 = local_74, uVar3 = color<unsigned_int,_4U>::comps_count(&local_30), uVar5 < uVar3) {
    this = (AssertHelper *)color<unsigned_int,_4U>::operator[](&local_30,local_74);
    color<unsigned_int,_4U>::operator[](&local_20,local_74);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((char *)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
               (uint *)CONCAT44(uVar5,in_stack_ffffffffffffff38),(uint *)this);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff60);
      testing::AssertionResult::failure_message((AssertionResult *)0x11eced);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff60,type,(char *)CONCAT44(uVar6,in_stack_ffffffffffffff50),
                 (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(char *)in_stack_ffffffffffffff40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
      testing::internal::AssertHelper::~AssertHelper(this);
      testing::Message::~Message((Message *)0x11ed39);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ed89);
    local_74 = local_74 + 1;
  }
  return;
}

Assistant:

void test_color(ColorType input, ColorType output) {
    ColorType color;
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        color.set(i, static_cast<typename ColorType::value_type>(input[i]));
    }

    // Verify color components were set correctly
    for (uint32_t i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(input[i]));
    }

    color.normalize();

    for (uint32_t  i = 0; i < color.comps_count(); ++i) {
        EXPECT_EQ(color[i], static_cast<typename ColorType::value_type>(output[i]));
    }
}